

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O1

Bool Ppmd7_Alloc(CPpmd7 *p,UInt32 size,ISzAlloc *alloc)

{
  Bool BVar1;
  Byte *pBVar2;
  
  if ((p->Base == (Byte *)0x0) || (BVar1 = 1, p->Size != size)) {
    (*alloc->Free)(alloc,p->Base);
    p->Size = 0;
    p->Base = (Byte *)0x0;
    p->AlignOffset = 4 - (size & 3);
    pBVar2 = (Byte *)(*alloc->Alloc)(alloc,(ulong)((size & 0xfffffffc) + 0x10));
    p->Base = pBVar2;
    if (pBVar2 == (Byte *)0x0) {
      BVar1 = 0;
    }
    else {
      p->Size = size;
      BVar1 = 1;
    }
  }
  return BVar1;
}

Assistant:

static Bool Ppmd7_Alloc(CPpmd7 *p, UInt32 size, ISzAlloc *alloc)
{
  if (p->Base == 0 || p->Size != size)
  {
    Ppmd7_Free(p, alloc);
    p->AlignOffset =
      #ifdef PPMD_32BIT
        (4 - size) & 3;
      #else
        4 - (size & 3);
      #endif
    if ((p->Base = (Byte *)alloc->Alloc(alloc, p->AlignOffset + size
        #ifndef PPMD_32BIT
        + UNIT_SIZE
        #endif
        )) == 0)
      return False;
    p->Size = size;
  }
  return True;
}